

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
::removeLast(ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
             *this)

{
  RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
  *pRVar1;
  uint *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = this->pos;
  this->pos = pRVar1 + -1;
  puVar2 = pRVar1[-1].value.paramExports.ptr;
  if (puVar2 != (uint *)0x0) {
    sVar3 = pRVar1[-1].value.paramExports.size_;
    pRVar1[-1].value.paramExports.ptr = (uint *)0x0;
    pRVar1[-1].value.paramExports.size_ = 0;
    pAVar4 = pRVar1[-1].value.paramExports.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,puVar2,4,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }